

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

Type * __thiscall soul::heart::ArrayElement::getType(ArrayElement *this)

{
  Category CVar1;
  Structure *pSVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  ArraySize newSize;
  Type local_38;
  Type *this_00;
  
  iVar4 = (*(((this->parent).object)->super_Object)._vptr_Object[2])();
  this_00 = (Type *)CONCAT44(extraout_var,iVar4);
  newSize = this->fixedEndIndex - this->fixedStartIndex;
  CVar1 = this_00->category;
  if (newSize == 1 || (this->dynamicIndex).object != (Expression *)0x0) {
    if (CVar1 == primitive) {
      Type::operator=(&this->temporaryType,this_00);
    }
    else {
      Type::getElementType(&local_38,this_00);
      (this->temporaryType).category = local_38.category;
      (this->temporaryType).arrayElementCategory = local_38.arrayElementCategory;
      (this->temporaryType).isRef = local_38.isRef;
      (this->temporaryType).isConstant = local_38.isConstant;
      (this->temporaryType).primitiveType.type = local_38.primitiveType.type;
      (this->temporaryType).boundingSize = local_38.boundingSize;
      (this->temporaryType).arrayElementBoundingSize = local_38.arrayElementBoundingSize;
      pSVar2 = (this->temporaryType).structure.object;
      if (local_38.structure.object != pSVar2) {
        (this->temporaryType).structure.object = local_38.structure.object;
        local_38.structure.object = (Structure *)0x0;
        RefCountedPtr<soul::Structure>::decIfNotNull(pSVar2);
      }
      RefCountedPtr<soul::Structure>::decIfNotNull(local_38.structure.object);
    }
  }
  else {
    if ((CVar1 & ~primitive) != vector) {
      throwInternalCompilerError
                ("aggregateType.isArray() || aggregateType.isVector()","getType",0x21a);
    }
    if ((CVar1 != array) || (this_00->boundingSize != 0)) {
      bVar3 = Type::isValidArrayOrVectorRange<unsigned_long>
                        (this_00,this->fixedStartIndex,this->fixedEndIndex);
      if (!bVar3) {
        throwInternalCompilerError
                  ("aggregateType.isUnsizedArray() || aggregateType.isValidArrayOrVectorRange (fixedStartIndex, fixedEndIndex)"
                   ,"getType",0x21b);
      }
    }
    Type::createCopyWithNewArraySize(&local_38,this_00,newSize);
    (this->temporaryType).category = local_38.category;
    (this->temporaryType).arrayElementCategory = local_38.arrayElementCategory;
    (this->temporaryType).isRef = local_38.isRef;
    (this->temporaryType).isConstant = local_38.isConstant;
    (this->temporaryType).primitiveType.type = local_38.primitiveType.type;
    (this->temporaryType).boundingSize = local_38.boundingSize;
    (this->temporaryType).arrayElementBoundingSize = local_38.arrayElementBoundingSize;
    pSVar2 = (this->temporaryType).structure.object;
    if (local_38.structure.object != pSVar2) {
      (this->temporaryType).structure.object = local_38.structure.object;
      local_38.structure.object = (Structure *)0x0;
      RefCountedPtr<soul::Structure>::decIfNotNull(pSVar2);
    }
    RefCountedPtr<soul::Structure>::decIfNotNull(local_38.structure.object);
  }
  return &this->temporaryType;
}

Assistant:

const Type& getType() const override
        {
            const auto& aggregateType = parent->getType();
            auto sliceSize = getSliceSize();

            if (sliceSize == 1)
            {
                if (aggregateType.isPrimitive())
                    temporaryType = aggregateType;
                else
                    temporaryType = aggregateType.getElementType();
            }
            else
            {
                SOUL_ASSERT (aggregateType.isArray() || aggregateType.isVector());
                SOUL_ASSERT (aggregateType.isUnsizedArray() || aggregateType.isValidArrayOrVectorRange (fixedStartIndex, fixedEndIndex));

                temporaryType = aggregateType.createCopyWithNewArraySize (sliceSize);
            }

            return temporaryType;
        }